

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ronan.cpp
# Opt level: O3

void ronanCBProcess(syWRonan *wsptr,float *buf,uint32_t len)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ResDef *pRVar5;
  ResDef *pRVar6;
  ResDef *pRVar7;
  float *pfVar8;
  uint32_t i;
  long lVar9;
  uint32_t i_1;
  ulong uVar10;
  uint32_t uVar11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float afStack_84 [8];
  syVRonan deltaframe;
  
  lVar9 = 0;
  do {
    afStack_84[lVar9] =
         ((&(wsptr->newframe).rdef[0].a)[lVar9] - (&(wsptr->super_syVRonan).rdef[0].a)[lVar9]) *
         (1.0 / (float)len);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x19);
  if (len != 0) {
    pRVar5 = wsptr->res[0].def;
    pRVar6 = wsptr->res[1].def;
    pRVar7 = (wsptr->peq1).def;
    uVar11 = wsptr->nseed;
    uVar12 = 0;
    do {
      lVar9 = 0;
      do {
        (&(wsptr->super_syVRonan).rdef[0].a)[lVar9] =
             afStack_84[lVar9] + (&(wsptr->super_syVRonan).rdef[0].a)[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x19);
      uVar10 = (ulong)(uint)((int)uVar12 * 2);
      fVar13 = wsptr->nout * 0.75 +
               (float)(uVar11 * 0xbb38435 + 0x3619636b >> 9 | 0x40000000) + -3.0;
      fVar14 = buf[uVar10] * (wsptr->super_syVRonan).a_voicing +
               fVar13 * 0.25 * (wsptr->super_syVRonan).a_aspiration;
      fVar16 = wsptr->res[0].p1;
      fVar18 = pRVar5->a;
      fVar17 = pRVar5->b;
      fVar15 = pRVar5->c;
      fVar1 = wsptr->res[0].p2;
      wsptr->res[0].p2 = fVar16;
      fVar2 = wsptr->res[1].p1;
      fVar16 = fVar1 * fVar15 + fVar14 * fVar18 + fVar16 * fVar17;
      fVar18 = wsptr->res[1].p2 * pRVar6->c + fVar14 * pRVar6->a + fVar2 * pRVar6->b;
      wsptr->res[0].p1 = fVar16;
      wsptr->res[1].p2 = fVar2;
      wsptr->res[1].p1 = fVar18;
      fVar18 = fVar18 + fVar16;
      uVar11 = uVar11 * -0x4b9b4d07 + 0x9d6f2492;
      fVar16 = fVar13 * 0.75 + (float)(uVar11 >> 9 | 0x40000000) + -3.0;
      wsptr->nout = fVar16;
      fVar16 = (fVar16 * 0.25 * (wsptr->super_syVRonan).a_frication + fVar14) - wsptr->lastin2;
      wsptr->lastin2 = fVar14;
      lVar9 = 0;
      do {
        pfVar8 = *(float **)((long)&wsptr->res[2].def + lVar9);
        fVar17 = *(float *)((long)&wsptr->res[2].p1 + lVar9);
        fVar15 = pfVar8[2] * *(float *)((long)&wsptr->res[2].p2 + lVar9) +
                 *pfVar8 * fVar16 + pfVar8[1] * fVar17;
        *(float *)((long)&wsptr->res[2].p2 + lVar9) = fVar17;
        *(float *)((long)&wsptr->res[2].p1 + lVar9) = fVar15;
        fVar18 = fVar15 - fVar18;
        lVar9 = lVar9 + 0x10;
      } while (lVar9 != 0x50);
      uVar3 = wsptr->hpb1;
      uVar4 = wsptr->hpb2;
      fVar16 = (fVar16 * (wsptr->super_syVRonan).a_bypass - fVar18) - (float)uVar3;
      fVar17 = fVar16 - (float)uVar4;
      wsptr->hpb1 = fVar16 * 0.012 + (float)uVar3;
      wsptr->hpb2 = fVar17 * 0.012 + (float)uVar4;
      fVar16 = (wsptr->peq1).p1;
      fVar18 = pRVar7->c * (wsptr->peq1).p2 + pRVar7->a * fVar17 + pRVar7->b * fVar16;
      (wsptr->peq1).p2 = fVar16;
      (wsptr->peq1).p1 = fVar18;
      fVar18 = fVar18 - fVar17;
      buf[uVar10 + 1] = fVar18;
      buf[uVar10] = fVar18;
      uVar12 = uVar12 + 1;
    } while (uVar12 != len);
    wsptr->nseed = uVar11;
  }
  return;
}

Assistant:

void ronanCBProcess(syWRonan *wsptr, float *buf, uint32_t len)
{
    syVRonan deltaframe;

    // prepare interpolation
    {
        float *src1 = (float*)wsptr;
        float *src2 = (float*)&wsptr->newframe;
        float *dest = (float*)&deltaframe;
        float mul   = 1.0f/(float)len;
        for (uint32_t i = 0; i < (sizeof(syVRonan)/sizeof(float)); i++)
            dest[i] = (src2[i] - src1[i])*mul;
    }

    for (uint32_t i = 0; i < len; i++)
    {
        // interpolate all values
        {
            float *src  = (float*)&deltaframe;
            float *dest = (float*)wsptr;
            for (uint32_t i = 0; i < (sizeof(syVRonan)/sizeof(float)); i++)
                dest[i] += src[i];
        }

        float in = buf[2*i];

        // add aspiration noise
        in = in*wsptr->a_voicing + wsptr->noise()*wsptr->a_aspiration;

        // process complete input signal with f1/nasal filters
        float out = wsptr->res[0].tick(in) + wsptr->res[1].tick(in);

        // differentiate input signal, add frication noise
        float lin = in;
        in = (wsptr->noise()*wsptr->a_frication) + in - wsptr->lastin2;
        wsptr->lastin2 = lin;

        // process diff/fric input signal with f2..f6 and bypass (phase inverted)
        for (int r = 2; r < 7; r++)
            out = wsptr->res[r].tick(in) - out;

        out = in*wsptr->a_bypass - out;

        // high pass filter
        wsptr->hpb1 += 0.012f*(out = out - wsptr->hpb1);
        wsptr->hpb2 += 0.012f*(out = out - wsptr->hpb2);

        // EQ
        out = wsptr->peq1.tick(out) - out;

        buf[2*i] = buf[2*i + 1] = out;
    }
}